

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend_openssl.cpp
# Opt level: O1

QString * QTlsBackendOpenSSL::getErrorsFromOpenSsl(void)

{
  char *pcVar1;
  unsigned_long e;
  char *pcVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1String QVar3;
  QLatin1String QVar4;
  char buf [256];
  char local_128 [256];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = (char16_t *)0x0;
  (in_RDI->d).size = 0;
  memset(local_128,0,0x100);
  e = q_ERR_get_error();
  while (e != 0) {
    if ((in_RDI->d).size != 0) {
      QVar3.m_data = (char *)0x2;
      QVar3.m_size = (qsizetype)in_RDI;
      QString::append(QVar3);
    }
    q_ERR_error_string_n(e,local_128,0x100);
    pcVar2 = (char *)0xffffffffffffffff;
    do {
      pcVar1 = local_128 + 1 + (long)pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (*pcVar1 != '\0');
    QVar4.m_data = pcVar2;
    QVar4.m_size = (qsizetype)in_RDI;
    QString::append(QVar4);
    e = q_ERR_get_error();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QTlsBackendOpenSSL::getErrorsFromOpenSsl()
{
    QString errorString;
    char buf[256] = {}; // OpenSSL docs claim both 120 and 256; use the larger.
    unsigned long errNum;
    while ((errNum = q_ERR_get_error())) {
        if (!errorString.isEmpty())
            errorString.append(", "_L1);
        q_ERR_error_string_n(errNum, buf, sizeof buf);
        errorString.append(QLatin1StringView(buf)); // error is ascii according to man ERR_error_string
    }
    return errorString;
}